

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_147e942::TRDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,TRDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> scripts,
          FlatSigningProvider *out)

{
  uint uVar1;
  pointer pCVar2;
  uint uVar3;
  CScript *pCVar4;
  bool bVar5;
  pointer piVar6;
  mapped_type *pmVar7;
  CScript *pCVar8;
  long lVar9;
  XOnlyPubKey *pXVar10;
  XOnlyPubKey *pXVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  byte bVar13;
  Span<const_unsigned_char> script;
  WitnessV1Taproot output;
  XOnlyPubKey xpk;
  TaprootBuilder builder;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_158;
  undefined1 local_110;
  direct_or_indirect local_108;
  uint local_ec;
  key_type local_e8;
  XOnlyPubKey local_c8;
  TaprootBuilder local_a0;
  long local_38;
  
  pCVar8 = scripts.m_data;
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.m_valid = true;
  local_a0.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a0.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a0.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  if ((long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 != scripts.m_size) {
    __assert_fail("m_depths.size() == scripts.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                  ,0x496,
                  "virtual std::vector<CScript> (anonymous namespace)::TRDescriptor::MakeScripts(const std::vector<CPubKey> &, Span<const CScript>, FlatSigningProvider &) const"
                 );
  }
  piVar6 = (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar6) {
    uVar12 = 0;
    do {
      uVar1 = (pCVar8->super_CScriptBase)._size;
      uVar3 = uVar1 - 0x1d;
      pCVar4 = (CScript *)(pCVar8->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        uVar3 = uVar1;
        pCVar4 = pCVar8;
      }
      script.m_size._0_4_ = uVar3;
      script.m_data = (uchar *)pCVar4;
      script.m_size._4_4_ = 0;
      TaprootBuilder::Add(&local_a0,piVar6[uVar12],script,0xc0,true);
      uVar12 = uVar12 + 1;
      piVar6 = (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar8 = pCVar8 + 1;
    } while (uVar12 < (ulong)((long)(this->m_depths).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2));
  }
  if ((local_a0.m_valid == true) &&
     ((lVar9 = (long)local_a0.m_branch.
                     super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a0.m_branch.
                     super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6, lVar9 == 0 ||
      ((lVar9 == 1 &&
       (((local_a0.m_branch.
          super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>)._M_payload.
        super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
        super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_engaged != false)))))) {
    pCVar2 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pCVar2 != 0x41) {
      __assert_fail("keys.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                    ,0x49b,
                    "virtual std::vector<CScript> (anonymous namespace)::TRDescriptor::MakeScripts(const std::vector<CPubKey> &, Span<const CScript>, FlatSigningProvider &) const"
                   );
    }
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(pCVar2->vch + 1);
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)(pCVar2->vch + 9);
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)(pCVar2->vch + 0x11);
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)(pCVar2->vch + 0x19);
    bVar5 = XOnlyPubKey::IsFullyValid(&local_c8);
    if (bVar5) {
      TaprootBuilder::Finalize(&local_a0,&local_c8);
      TaprootBuilder::GetOutput((WitnessV1Taproot *)&local_e8,&local_a0);
      pmVar7 = std::
               map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
               ::operator[](&out->tr_trees,&local_e8);
      pmVar7->m_valid = local_a0.m_valid;
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::operator=(&pmVar7->m_branch,&local_a0.m_branch);
      pXVar10 = &local_a0.m_internal_key;
      pXVar11 = &pmVar7->m_internal_key;
      for (lVar9 = 8; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)(pXVar11->m_keydata).super_base_blob<256U>.m_data._M_elems =
             *(undefined8 *)(pXVar10->m_keydata).super_base_blob<256U>.m_data._M_elems;
        pXVar10 = (XOnlyPubKey *)((long)pXVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        pXVar11 = (XOnlyPubKey *)((long)pXVar11 + (ulong)bVar13 * -0x10 + 8);
      }
      pmVar7->m_parity = local_a0.m_parity;
      CPubKey::GetID((CKeyID *)&local_158._M_first,
                     (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                     super__Vector_impl_data._M_start);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<CKeyID,CPubKey_const&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)&out->pubkeys,(CKeyID *)&local_158._M_first,
                 (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      local_158._M_first._M_storage._M_storage[0x10] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10];
      local_158._M_first._M_storage._M_storage[0x11] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11];
      local_158._M_first._M_storage._M_storage[0x12] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12];
      local_158._M_first._M_storage._M_storage[0x13] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13];
      local_158._M_first._M_storage._M_storage[0x14] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14];
      local_158._M_first._M_storage._M_storage[0x15] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15];
      local_158._M_first._M_storage._M_storage[0x16] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16];
      local_158._M_first._M_storage._M_storage[0x17] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17];
      local_158._M_first._M_storage._M_storage[0x18] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18];
      local_158._M_first._M_storage._M_storage[0x19] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19];
      local_158._M_first._M_storage._M_storage[0x1a] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_158._M_first._M_storage._M_storage[0x1b] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_158._M_first._M_storage._M_storage[0x1c] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_158._M_first._M_storage._M_storage[0x1d] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_158._M_first._M_storage._M_storage[0x1e] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_158._M_first._M_storage._M_storage[0x1f] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_158._M_first._M_storage._M_storage[0] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0];
      local_158._M_first._M_storage._M_storage[1] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[1];
      local_158._M_first._M_storage._M_storage[2] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[2];
      local_158._M_first._M_storage._M_storage[3] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[3];
      local_158._M_first._M_storage._M_storage[4] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[4];
      local_158._M_first._M_storage._M_storage[5] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[5];
      local_158._M_first._M_storage._M_storage[6] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[6];
      local_158._M_first._M_storage._M_storage[7] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[7];
      local_158._M_first._M_storage._M_storage[8] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[8];
      local_158._M_first._M_storage._M_storage[9] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[9];
      local_158._M_first._M_storage._M_storage[10] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[10];
      local_158._M_first._M_storage._M_storage[0xb] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb];
      local_158._M_first._M_storage._M_storage[0xc] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc];
      local_158._M_first._M_storage._M_storage[0xd] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd];
      local_158._M_first._M_storage._M_storage[0xe] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe];
      local_158._M_first._M_storage._M_storage[0xf] =
           local_e8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf];
      local_110 = 6;
      GetScriptForDestination
                ((CScript *)&local_108.indirect_contents,(CTxDestination *)&local_158._M_first);
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
      std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
                (__return_storage_ptr__,(CScript *)&local_108.indirect_contents);
      if (0x1c < local_ec) {
        free(local_108.indirect_contents.indirect);
        local_108.indirect_contents.indirect = (char *)0x0;
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_158._M_first);
    }
    else {
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
  }
  else {
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ::~vector(&local_a0.m_branch);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        TaprootBuilder builder;
        assert(m_depths.size() == scripts.size());
        for (size_t pos = 0; pos < m_depths.size(); ++pos) {
            builder.Add(m_depths[pos], scripts[pos], TAPROOT_LEAF_TAPSCRIPT);
        }
        if (!builder.IsComplete()) return {};
        assert(keys.size() == 1);
        XOnlyPubKey xpk(keys[0]);
        if (!xpk.IsFullyValid()) return {};
        builder.Finalize(xpk);
        WitnessV1Taproot output = builder.GetOutput();
        out.tr_trees[output] = builder;
        out.pubkeys.emplace(keys[0].GetID(), keys[0]);
        return Vector(GetScriptForDestination(output));
    }